

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

string * flatbuffers::BufferToHexText
                   (string *__return_storage_ptr__,void *buffer,size_t buffer_size,size_t max_length
                   ,string *wrapped_line_prefix,string *wrapped_line_suffix)

{
  size_type sVar1;
  int xdigits;
  ulong uVar2;
  string local_50;
  ulong uVar3;
  
  xdigits = (int)max_length;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)wrapped_line_prefix);
  if (buffer != (void *)0x0) {
    sVar1 = 0;
    uVar2 = 0;
    do {
      uVar3 = uVar2;
      do {
        do {
          uVar2 = uVar3 + 1;
          if (uVar2 - buffer_size == 1) goto LAB_001710c5;
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          IntToStringHex_abi_cxx11_
                    (&local_50,(flatbuffers *)(ulong)*(byte *)((long)buffer + uVar3),2,xdigits);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_50);
          uVar3 = uVar2;
        } while (buffer_size <= uVar2);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      } while (wrapped_line_suffix->_M_string_length + __return_storage_ptr__->_M_string_length <
               sVar1 + max_length);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      sVar1 = __return_storage_ptr__->_M_string_length;
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    } while( true );
  }
LAB_001710c5:
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline std::string BufferToHexText(const void *buffer, size_t buffer_size,
                                   size_t max_length,
                                   const std::string &wrapped_line_prefix,
                                   const std::string &wrapped_line_suffix) {
  std::string text = wrapped_line_prefix;
  size_t start_offset = 0;
  const char *s = reinterpret_cast<const char *>(buffer);
  for (size_t i = 0; s && i < buffer_size; i++) {
    // Last iteration or do we have more?
    bool have_more = i + 1 < buffer_size;
    text += "0x";
    text += IntToStringHex(static_cast<uint8_t>(s[i]), 2);
    if (have_more) { text += ','; }
    // If we have more to process and we reached max_length
    if (have_more &&
        text.size() + wrapped_line_suffix.size() >= start_offset + max_length) {
      text += wrapped_line_suffix;
      text += '\n';
      start_offset = text.size();
      text += wrapped_line_prefix;
    }
  }
  text += wrapped_line_suffix;
  return text;
}